

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O2

void cio_b64_encode_buffer(uint8_t *in,size_t in_length,char *out)

{
  char cVar1;
  uint uVar2;
  uint i;
  long lVar3;
  uint uVar4;
  char cVar5;
  char cVar6;
  uint local_1c [4];
  uint triple [3];
  
  while (in_length != 0) {
    uVar2 = 0;
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      if (in_length == 0) {
        uVar4 = 0;
        in_length = 0;
      }
      else {
        uVar4 = (uint)*in;
        in = in + 1;
        uVar2 = uVar2 + 1;
        in_length = in_length - 1;
      }
      local_1c[lVar3] = uVar4;
    }
    cVar5 = '=';
    if (uVar2 < 2) {
      cVar6 = '=';
    }
    else {
      cVar6 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
              [(local_1c[2] >> 6 & 3) + (local_1c[1] & 0xf) * 4];
      if (uVar2 != 2) {
        cVar5 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                [local_1c[2] & 0x3f];
      }
    }
    cVar1 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
            [local_1c[1] >> 4 & 0xf | (local_1c[0] & 3) << 4];
    *out = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[local_1c[0] >> 2];
    out[1] = cVar1;
    out[2] = cVar6;
    out[3] = cVar5;
    out = out + 4;
  }
  return;
}

Assistant:

void cio_b64_encode_buffer(const uint8_t *__restrict in, size_t in_length, char *__restrict out)
{
	while (in_length) {
		unsigned int len = 0;
		unsigned int triple[3];
		for (unsigned int i = 0; i < 3; i++) {
			if (in_length) {
				triple[i] = *in++;
				len++;
				in_length--;
			} else {
				triple[i] = 0;
			}
		}

		char tmp[4];
		tmp[0] = ENCODE_TABLE[triple[0] >> 2U];
		tmp[1] = ENCODE_TABLE[((triple[0] & 0x03U) << 4U) | ((triple[1] & 0xf0U) >> 4U)]; // NOLINT
		if (cio_likely(len > 1)) {
			tmp[2] = ENCODE_TABLE[((triple[1] & 0x0fU) << 2U) | ((triple[2] & 0xc0U) >> 6U)]; // NOLINT
		} else {
			tmp[2] = '=';
		}
		if (cio_likely(len > 2)) {
			tmp[3] = ENCODE_TABLE[triple[2] & 0x3fU]; // NOLINT
		} else {
			tmp[3] = '=';
		}
		memcpy(out, tmp, sizeof(tmp));
		out += 4;
	}
}